

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_lazy_xor(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte bVar1;
  long lVar2;
  roaring_array_t *prVar3;
  uint uVar4;
  container_t *pcVar5;
  int *c;
  roaring_bitmap_t *prVar6;
  uint uVar7;
  uint end_index;
  int *piVar8;
  ushort key;
  uint8_t uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  roaring_array_t *prVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_75;
  uint8_t local_74;
  uint8_t local_73;
  uint16_t local_72;
  ulong local_70;
  ulong local_68;
  roaring_array_t *local_60;
  ulong local_58;
  roaring_array_t *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_73 = '\0';
  uVar4 = (x1->high_low_container).size;
  prVar6 = x2;
  if (uVar4 != 0) {
    uVar7 = (x2->high_low_container).size;
    local_68 = (ulong)uVar7;
    prVar6 = x1;
    if (uVar7 != 0) {
      local_60 = &roaring_bitmap_create_with_capacity(uVar7 + uVar4)->high_low_container;
      if ((((x1->high_low_container).flags & 1) == 0) && (((x2->high_low_container).flags & 1) == 0)
         ) {
        local_60->flags = local_60->flags & 0xfe;
      }
      else {
        local_60->flags = local_60->flags | 1;
      }
      key = *(x1->high_low_container).keys;
      local_72 = *(x2->high_low_container).keys;
      local_58 = (ulong)-uVar4;
      local_70 = 0;
      uVar12 = 0;
      local_50 = &x2->high_low_container;
      local_48 = (ulong)uVar4;
LAB_0010aa5e:
      do {
        iVar10 = (int)uVar12;
        uVar17 = uVar12 & 0xffffffff;
        iVar16 = (int)local_58 + iVar10;
        local_38 = (long)iVar10 * 8;
        lVar15 = 0;
        local_40 = uVar12;
        while( true ) {
          prVar13 = local_50;
          iVar14 = (int)lVar15;
          uVar4 = (uint)local_70;
          if (key == local_72) break;
          if (local_72 <= key) {
            local_75 = local_50->typecodes[local_70 & 0xffff];
            pcVar5 = get_copy_of_container
                               (local_50->containers[local_70 & 0xffff],&local_75,
                                (_Bool)(local_50->flags & 1));
            if ((prVar13->flags & 1) != 0) {
              prVar13->containers[(int)uVar4] = pcVar5;
              prVar13->typecodes[(int)uVar4] = local_75;
            }
            ra_append(local_60,local_72,pcVar5,local_75);
            local_70 = (ulong)(uVar4 + 1);
            uVar7 = (uint)local_68;
            if (uVar4 + 1 == uVar7) {
              uVar4 = iVar14 + iVar10;
              goto LAB_0010ad3b;
            }
            local_72 = prVar13->keys[local_70 & 0xffff];
            uVar12 = uVar17 + lVar15 & 0xffffffff;
            goto LAB_0010aa5e;
          }
          uVar12 = uVar17 + lVar15 & 0xffff;
          local_74 = (x1->high_low_container).typecodes[uVar12];
          pcVar5 = get_copy_of_container
                             ((x1->high_low_container).containers[uVar12],&local_74,
                              (_Bool)((x1->high_low_container).flags & 1));
          if (((x1->high_low_container).flags & 1) != 0) {
            *(container_t **)((long)(x1->high_low_container).containers + lVar15 * 8 + local_38) =
                 pcVar5;
            (x1->high_low_container).typecodes[lVar15 + iVar10] = local_74;
          }
          ra_append(local_60,key,pcVar5,local_74);
          if (iVar16 + iVar14 != -1) {
            key = (x1->high_low_container).keys[(ushort)((short)uVar17 + (short)lVar15 + 1)];
          }
          lVar15 = lVar15 + 1;
          if ((int)lVar15 + iVar16 == 0) {
            uVar4 = (int)local_40 + (int)lVar15;
            prVar13 = local_50;
            goto LAB_0010ad36;
          }
        }
        uVar7 = iVar10 + iVar14 & 0xffff;
        local_74 = (x1->high_low_container).typecodes[uVar7];
        local_75 = local_50->typecodes[uVar4 & 0xffff];
        c = (int *)container_lazy_xor((x1->high_low_container).containers[uVar7],local_74,
                                      local_50->containers[uVar4 & 0xffff],local_75,&local_73);
        piVar8 = c;
        uVar9 = local_73;
        if (local_73 == '\x04') {
          uVar9 = (uint8_t)c[2];
          piVar8 = *(int **)c;
        }
        iVar16 = *piVar8;
        if ((uVar9 == '\x03') || (uVar9 == '\x02')) {
          bVar18 = 0 < iVar16;
        }
        else {
          if (iVar16 == -1) {
            if (**(long **)(piVar8 + 2) == 0) {
              uVar12 = 0xffffffffffffffff;
              do {
                if (uVar12 == 0x3fe) {
                  uVar11 = 0x3ff;
                  break;
                }
                uVar11 = uVar12 + 1;
                lVar2 = uVar12 + 2;
                uVar12 = uVar11;
              } while ((*(long **)(piVar8 + 2))[lVar2] == 0);
              bVar18 = 0x3fe < uVar11;
            }
            else {
              bVar18 = false;
            }
          }
          else {
            bVar18 = iVar16 == 0;
          }
          bVar18 = (bool)(bVar18 ^ 1);
        }
        if (bVar18) {
          ra_append(local_60,key,c,local_73);
        }
        else {
          container_free(c,local_73);
        }
        uVar12 = uVar17 + lVar15 + 1;
        uVar4 = uVar4 + 1;
        local_70 = (ulong)uVar4;
        if (uVar4 == (uint)local_68 || (int)local_58 + iVar10 + iVar14 == -1) {
          uVar4 = iVar14 + iVar10 + 1;
LAB_0010ad36:
          uVar7 = (uint)local_68;
LAB_0010ad3b:
          prVar3 = local_60;
          end_index = (uint)local_48;
          if (uVar4 == end_index) {
            bVar1 = prVar13->flags;
            x1 = (roaring_bitmap_t *)prVar13;
            end_index = uVar7;
            uVar4 = (uint)local_70;
          }
          else {
            if ((uint)local_70 != uVar7) {
              return (roaring_bitmap_t *)local_60;
            }
            bVar1 = (x1->high_low_container).flags;
          }
          ra_append_copy_range(local_60,&x1->high_low_container,uVar4,end_index,(_Bool)(bVar1 & 1));
          return (roaring_bitmap_t *)prVar3;
        }
        key = (x1->high_low_container).keys[(uint)uVar12 & 0xffff];
        local_72 = prVar13->keys[uVar4 & 0xffff];
      } while( true );
    }
  }
  prVar6 = roaring_bitmap_copy(prVar6);
  return prVar6;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_xor(const roaring_bitmap_t *x1,
                                          const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c =
                container_lazy_xor(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}